

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptFields.cpp
# Opt level: O0

void __thiscall
GlobOpt::KillObjectHeaderInlinedTypeSyms
          (GlobOpt *this,BasicBlock *block,bool isObjTypeSpecialized,SymID opndId)

{
  SymID opndId_local;
  bool isObjTypeSpecialized_local;
  BasicBlock *block_local;
  GlobOpt *this_local;
  
  MapObjectHeaderInlinedTypeSymsUntil<GlobOpt::KillObjectHeaderInlinedTypeSyms(BasicBlock*,bool,unsigned_int)::__0>
            (this,block,isObjTypeSpecialized,opndId,(anon_class_8_1_8991fb9c)this);
  return;
}

Assistant:

void
GlobOpt::KillObjectHeaderInlinedTypeSyms(BasicBlock *block, bool isObjTypeSpecialized, SymID opndId)
{
    this->MapObjectHeaderInlinedTypeSymsUntil(block, isObjTypeSpecialized, opndId, [&](SymID symId)->bool  { this->currentBlock->globOptData.liveFields->Clear(symId); return false; });
}